

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O1

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateLine(HtmlparserCppTest *this,string *expected_line)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  bool bVar2;
  int iVar3;
  char *in_RAX;
  char *extraout_RAX;
  char *extraout_RAX_00;
  int *piVar4;
  HtmlParser *this_00;
  const_iterator cVar5;
  mapped_type *ppHVar6;
  undefined8 extraout_RAX_01;
  string *psVar7;
  HtmlparserCppTest *pHVar8;
  HtmlparserCppTest *pHVar9;
  pointer this_01;
  string *unaff_R12;
  long unaff_R14;
  pointer str_00;
  int *unaff_R15;
  char *error_pos;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_d8;
  HtmlparserCppTest *pHStack_c0;
  undefined1 *puStack_b8;
  string sStack_78;
  int *piStack_58;
  string sStack_50;
  int *piStack_30;
  _Alloc_hider local_28;
  
  psVar7 = (string *)&local_28;
  if (expected_line->_M_string_length == 0) {
    bVar2 = false;
    pHVar8 = this;
  }
  else {
    piStack_30 = (int *)0x1072b8;
    local_28._M_p = in_RAX;
    unaff_R15 = __errno_location();
    *unaff_R15 = 0;
    pHVar8 = (HtmlparserCppTest *)(expected_line->_M_dataplus)._M_p;
    piStack_30 = (int *)0x1072d4;
    unaff_R14 = strtol((char *)pHVar8,&local_28._M_p,10);
    expected_line = psVar7;
    if (*local_28._M_p == '\0') {
      bVar2 = *unaff_R15 == 0;
      unaff_R12 = (string *)&local_28;
    }
    else {
      bVar2 = false;
      unaff_R12 = (string *)&local_28;
    }
  }
  if (bVar2) {
    pHVar8 = (HtmlparserCppTest *)(this->parser_).parser_;
    piStack_30 = (int *)0x1072fc;
    iVar3 = ctemplate_htmlparser::htmlparser_get_line_number((htmlparser_ctx_s *)pHVar8);
    if ((int)unaff_R14 == iVar3) {
      return;
    }
  }
  else {
    piStack_30 = (int *)0x107312;
    ValidateLine();
  }
  piStack_30 = (int *)0x107317;
  ValidateLine();
  psVar7 = &sStack_50;
  sStack_50._M_string_length = (size_type)this;
  sStack_50.field_2._M_allocated_capacity = (size_type)unaff_R12;
  sStack_50.field_2._8_8_ = unaff_R14;
  piStack_30 = unaff_R15;
  if (expected_line->_M_string_length == 0) {
    bVar2 = false;
    pHVar9 = pHVar8;
  }
  else {
    piStack_58 = (int *)0x107332;
    sStack_50._M_dataplus._M_p = extraout_RAX;
    unaff_R15 = __errno_location();
    *unaff_R15 = 0;
    pHVar9 = (HtmlparserCppTest *)(expected_line->_M_dataplus)._M_p;
    piStack_58 = (int *)0x10734e;
    unaff_R14 = strtol((char *)pHVar9,(char **)&sStack_50,10);
    expected_line = psVar7;
    if (*sStack_50._M_dataplus._M_p == '\0') {
      bVar2 = *unaff_R15 == 0;
      unaff_R12 = &sStack_50;
    }
    else {
      bVar2 = false;
      unaff_R12 = &sStack_50;
    }
  }
  if (bVar2) {
    pHVar9 = (HtmlparserCppTest *)(pHVar8->parser_).parser_;
    piStack_58 = (int *)0x107376;
    iVar3 = ctemplate_htmlparser::htmlparser_get_column_number((htmlparser_ctx_s *)pHVar9);
    if ((int)unaff_R14 == iVar3) {
      return;
    }
  }
  else {
    piStack_58 = (int *)0x10738c;
    ValidateColumn();
  }
  piStack_58 = (int *)0x107391;
  ValidateColumn();
  psVar7 = &sStack_78;
  sStack_78._M_string_length = (size_type)pHVar8;
  sStack_78.field_2._M_allocated_capacity = (size_type)unaff_R12;
  sStack_78.field_2._8_8_ = unaff_R14;
  piStack_58 = unaff_R15;
  if (expected_line->_M_string_length == 0) {
    bVar2 = false;
    pHVar8 = pHVar9;
  }
  else {
    sStack_78._M_dataplus._M_p = extraout_RAX_00;
    piVar4 = __errno_location();
    *piVar4 = 0;
    pHVar8 = (HtmlparserCppTest *)(expected_line->_M_dataplus)._M_p;
    unaff_R14 = strtol((char *)pHVar8,(char **)&sStack_78,10);
    expected_line = psVar7;
    if (*sStack_78._M_dataplus._M_p == '\0') {
      bVar2 = *piVar4 == 0;
      unaff_R12 = &sStack_78;
    }
    else {
      bVar2 = false;
      unaff_R12 = &sStack_78;
    }
  }
  if (bVar2) {
    pHVar8 = (HtmlparserCppTest *)(pHVar9->parser_).parser_;
    iVar3 = ctemplate_htmlparser::htmlparser_value_index((htmlparser_ctx_s *)pHVar8);
    if ((int)unaff_R14 == iVar3) {
      return;
    }
  }
  else {
    ValidateValueIndex();
  }
  ValidateValueIndex();
  bVar2 = StringToBool(expected_line);
  pHVar9 = (HtmlparserCppTest *)(pHVar8->parser_).parser_;
  iVar3 = ctemplate_htmlparser::htmlparser_is_url_start((htmlparser_ctx_s *)pHVar9);
  if (bVar2 == (iVar3 != 0)) {
    return;
  }
  ValidateIsUrlStart();
  vStack_d8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_d8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_d8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHStack_c0 = pHVar8;
  puStack_b8 = (undefined1 *)unaff_R12;
  SplitStringIntoKeyValuePairs(expected_line,"=",",",&vStack_d8);
  if (vStack_d8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vStack_d8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var1 = &(pHVar9->contextMap)._M_t._M_impl.super__Rb_tree_header;
    str_00 = vStack_d8.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      StripWhiteSpace(&str_00->first);
      str = &str_00->second;
      StripWhiteSpace(str);
      iVar3 = std::__cxx11::string::compare((char *)str_00);
      if (iVar3 == 0) {
        ValidateState(pHVar9,str);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)str_00);
        if (iVar3 == 0) {
          ValidateTag(pHVar9,str);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)str_00);
          if (iVar3 == 0) {
            ValidateAttribute(pHVar9,str);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)str_00);
            if (iVar3 == 0) {
              ValidateValue(pHVar9,str);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)str_00);
              if (iVar3 == 0) {
                ValidateAttributeType(pHVar9,str);
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)str_00);
                if (iVar3 == 0) {
                  ValidateAttributeQuoted(pHVar9,str);
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar3 == 0) {
                    ValidateInJavascript(pHVar9,str);
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar3 == 0) {
                      ValidateJavascriptQuoted(pHVar9,str);
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar3 == 0) {
                        ValidateJavascriptState(pHVar9,str);
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar3 == 0) {
                          ValidateInCss(pHVar9,str);
                        }
                        else {
                          iVar3 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar3 == 0) {
                            ValidateLine(pHVar9,str);
                          }
                          else {
                            iVar3 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar3 == 0) {
                              ValidateColumn(pHVar9,str);
                            }
                            else {
                              iVar3 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar3 == 0) {
                                ValidateValueIndex(pHVar9,str);
                              }
                              else {
                                iVar3 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar3 == 0) {
                                  ValidateIsUrlStart(pHVar9,str);
                                }
                                else {
                                  iVar3 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar3 == 0) {
                                    cVar5 = std::
                                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                            ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar9,str);
                                    if ((_Rb_tree_header *)cVar5._M_node == p_Var1) {
                                      this_00 = (HtmlParser *)operator_new(8);
                                      HtmlParser::HtmlParser(this_00);
                                      ppHVar6 = std::
                                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                ::operator[](&pHVar9->contextMap,str);
                                      *ppHVar6 = this_00;
                                    }
                                    ppHVar6 = std::
                                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                              ::operator[](&pHVar9->contextMap,str);
                                    HtmlParser::CopyFrom(*ppHVar6,&pHVar9->parser_);
                                  }
                                  else {
                                    iVar3 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar3 == 0) {
                                      cVar5 = std::
                                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                              ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar9,str);
                                      if ((_Rb_tree_header *)cVar5._M_node == p_Var1) {
                                        ProcessAnnotation();
LAB_0010784b:
                                        ProcessAnnotation();
                                        std::
                                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::~vector(&vStack_d8);
                                        _Unwind_Resume(extraout_RAX_01);
                                      }
                                      ppHVar6 = std::
                                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                ::operator[](&pHVar9->contextMap,str);
                                      HtmlParser::CopyFrom(&pHVar9->parser_,*ppHVar6);
                                    }
                                    else {
                                      iVar3 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar3 == 0) {
                                        bVar2 = StringToBool(str);
                                        if (bVar2) {
                                          ctemplate_htmlparser::htmlparser_reset
                                                    ((pHVar9->parser_).parser_);
                                        }
                                      }
                                      else {
                                        this_01 = str_00;
                                        iVar3 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar3 == 0) {
                                          iVar3 = NameToId((HtmlparserCppTest *)this_01,
                                                           (IdNameMap *)kResetModeMap,str);
                                          ctemplate_htmlparser::htmlparser_reset_mode
                                                    ((pHVar9->parser_).parser_,iVar3);
                                        }
                                        else {
                                          iVar3 = std::__cxx11::string::compare((char *)str_00);
                                          if (iVar3 != 0) goto LAB_0010784b;
                                          bVar2 = StringToBool(str);
                                          if (bVar2) {
                                            ctemplate_htmlparser::htmlparser_insert_text
                                                      ((pHVar9->parser_).parser_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      str_00 = str_00 + 1;
    } while (str_00 != vStack_d8.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_d8);
  return;
}

Assistant:

void HtmlparserCppTest::ValidateLine(const string &expected_line) {
  int line;
  CHECK(safe_strto32(expected_line, &line));
  EXPECT_EQ(line, parser_.line_number())
      << "Unexpected line count at line " << parser_.line_number();
}